

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O0

void __thiscall five_point_solver::advance_e(five_point_solver *this)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  celle ***pppcVar13;
  cellb ***pppcVar14;
  cellj ***pppcVar15;
  long in_RDI;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int k_3;
  int j_3;
  int i_3;
  int k_2;
  int j_2;
  int i_2;
  int k_1;
  int j_1;
  int i_1;
  int k;
  int j;
  int i;
  int nz;
  int ny;
  int nx;
  int in_stack_fffffffffffffbec;
  field3d<cellb> *in_stack_fffffffffffffbf0;
  int local_40;
  int local_3c;
  int local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int local_18;
  
  iVar10 = field3d<celle>::get_nx(*(field3d<celle> **)(in_RDI + 8));
  iVar11 = field3d<celle>::get_ny(*(field3d<celle> **)(in_RDI + 8));
  iVar12 = field3d<celle>::get_nz(*(field3d<celle> **)(in_RDI + 8));
  for (local_18 = 2; local_18 < iVar10 + -2; local_18 = local_18 + 1) {
    for (local_1c = 2; local_1c < iVar11 + -2; local_1c = local_1c + 1) {
      for (local_20 = 2; local_20 < iVar12 + -2; local_20 = local_20 + 1) {
        pppcVar13 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        dVar1 = (*pppcVar13)[local_1c][local_20].ex;
        uVar2 = *(ulong *)(in_RDI + 0x40);
        uVar3 = *(ulong *)(in_RDI + 0x70);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar4 = (*pppcVar14)[local_1c][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar5 = (*pppcVar14)[local_1c + -1][local_20].bz;
        dVar6 = *(double *)(in_RDI + 0x58);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar7 = (*pppcVar14)[local_1c + 1][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar8 = (*pppcVar14)[local_1c][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar9 = (*pppcVar14)[local_1c + -1][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar4 - dVar5;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar3;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = dVar1;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar2;
        auVar82._8_8_ = 0;
        auVar82._0_8_ =
             dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_1c + -2][local_20].bz);
        auVar31 = vfmadd213sd_fma(auVar16,auVar70,auVar82);
        auVar31 = vfmadd213sd_fma(auVar31,auVar34,auVar52);
        uVar2 = *(ulong *)(in_RDI + 0x48);
        uVar3 = *(ulong *)(in_RDI + 0x78);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar1 = (*pppcVar14)[local_1c][local_20].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar4 = (*pppcVar14)[local_1c][local_20 + -1].by;
        dVar5 = *(double *)(in_RDI + 0x60);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar6 = (*pppcVar14)[local_1c][local_20 + 1].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar7 = (*pppcVar14)[local_1c][local_20].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar8 = (*pppcVar14)[local_1c][local_20 + -1].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar1 - dVar4;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar3;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = auVar31._0_8_;
        auVar83._8_8_ = 0;
        auVar83._0_8_ =
             dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_1c][local_20 + -2].by);
        auVar31 = vfmadd213sd_fma(auVar17,auVar71,auVar83);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar2 ^ 0x8000000000000000;
        auVar31 = vfmadd213sd_fma(auVar31,auVar35,auVar53);
        pppcVar15 = field3d<cellj>::operator[]
                              ((field3d<cellj> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        auVar54._8_8_ = 0;
        auVar54._0_8_ = auVar31._0_8_;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(in_RDI + 0x20);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = -(*pppcVar15)[local_1c][local_20].jx;
        auVar31 = vfmadd213sd_fma(auVar18,auVar36,auVar54);
        pppcVar13 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        (*pppcVar13)[local_1c][local_20].ex = auVar31._0_8_;
        pppcVar13 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        dVar1 = (*pppcVar13)[local_1c][local_20].ey;
        uVar2 = *(ulong *)(in_RDI + 0x38);
        uVar3 = *(ulong *)(in_RDI + 0x68);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar4 = (*pppcVar14)[local_1c][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar5 = (*pppcVar14)[local_1c][local_20].bz;
        dVar6 = *(double *)(in_RDI + 0x50);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar7 = (*pppcVar14)[local_1c][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar8 = (*pppcVar14)[local_1c][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar9 = (*pppcVar14)[local_1c][local_20].bz;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar4 - dVar5;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar3;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = dVar1;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_1c][local_20].bz);
        auVar31 = vfmadd213sd_fma(auVar19,auVar72,auVar84);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar2 ^ 0x8000000000000000;
        auVar31 = vfmadd213sd_fma(auVar31,auVar37,auVar55);
        uVar2 = *(ulong *)(in_RDI + 0x48);
        uVar3 = *(ulong *)(in_RDI + 0x78);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar1 = (*pppcVar14)[local_1c][local_20].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar4 = (*pppcVar14)[local_1c][local_20 + -1].bx;
        dVar5 = *(double *)(in_RDI + 0x60);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar6 = (*pppcVar14)[local_1c][local_20 + 1].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar7 = (*pppcVar14)[local_1c][local_20].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar8 = (*pppcVar14)[local_1c][local_20 + -1].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar1 - dVar4;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = uVar3;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = auVar31._0_8_;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar2;
        auVar85._8_8_ = 0;
        auVar85._0_8_ =
             dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_1c][local_20 + -2].bx);
        auVar31 = vfmadd213sd_fma(auVar20,auVar73,auVar85);
        auVar31 = vfmadd213sd_fma(auVar31,auVar38,auVar56);
        pppcVar15 = field3d<cellj>::operator[]
                              ((field3d<cellj> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        auVar57._8_8_ = 0;
        auVar57._0_8_ = auVar31._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(in_RDI + 0x28);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = -(*pppcVar15)[local_1c][local_20].jy;
        auVar31 = vfmadd213sd_fma(auVar21,auVar39,auVar57);
        pppcVar13 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        (*pppcVar13)[local_1c][local_20].ey = auVar31._0_8_;
        pppcVar13 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        dVar1 = (*pppcVar13)[local_1c][local_20].ez;
        uVar2 = *(ulong *)(in_RDI + 0x38);
        uVar3 = *(ulong *)(in_RDI + 0x68);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar4 = (*pppcVar14)[local_1c][local_20].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar5 = (*pppcVar14)[local_1c][local_20].by;
        dVar6 = *(double *)(in_RDI + 0x50);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar7 = (*pppcVar14)[local_1c][local_20].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar8 = (*pppcVar14)[local_1c][local_20].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar9 = (*pppcVar14)[local_1c][local_20].by;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar4 - dVar5;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = uVar3;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = dVar1;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar2;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_1c][local_20].by);
        auVar31 = vfmadd213sd_fma(auVar22,auVar74,auVar86);
        auVar31 = vfmadd213sd_fma(auVar31,auVar40,auVar58);
        uVar2 = *(ulong *)(in_RDI + 0x40);
        uVar3 = *(ulong *)(in_RDI + 0x70);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar1 = (*pppcVar14)[local_1c][local_20].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar4 = (*pppcVar14)[local_1c + -1][local_20].bx;
        dVar5 = *(double *)(in_RDI + 0x58);
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar6 = (*pppcVar14)[local_1c + 1][local_20].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar7 = (*pppcVar14)[local_1c][local_20].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        dVar8 = (*pppcVar14)[local_1c + -1][local_20].bx;
        pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar1 - dVar4;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = uVar3;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = auVar31._0_8_;
        auVar87._8_8_ = 0;
        auVar87._0_8_ =
             dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_1c + -2][local_20].bx);
        auVar31 = vfmadd213sd_fma(auVar23,auVar75,auVar87);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar2 ^ 0x8000000000000000;
        auVar31 = vfmadd213sd_fma(auVar31,auVar41,auVar59);
        pppcVar15 = field3d<cellj>::operator[]
                              ((field3d<cellj> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        auVar60._8_8_ = 0;
        auVar60._0_8_ = auVar31._0_8_;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(in_RDI + 0x30);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = -(*pppcVar15)[local_1c][local_20].jz;
        auVar31 = vfmadd213sd_fma(auVar24,auVar42,auVar60);
        pppcVar13 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                              );
        (*pppcVar13)[local_1c][local_20].ez = auVar31._0_8_;
      }
    }
  }
  for (local_28 = 2; local_28 < iVar11 + -2; local_28 = local_28 + 1) {
    for (local_2c = 2; local_2c < iVar12 + -2; local_2c = local_2c + 1) {
      pppcVar13 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar1 = (*pppcVar13)[local_28][local_2c].ex;
      uVar2 = *(ulong *)(in_RDI + 0x40);
      uVar3 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar4 = (*pppcVar14)[local_28][local_2c].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar5 = (*pppcVar14)[local_28 + -1][local_2c].bz;
      dVar6 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar7 = (*pppcVar14)[local_28 + 1][local_2c].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar8 = (*pppcVar14)[local_28][local_2c].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar9 = (*pppcVar14)[local_28 + -1][local_2c].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar4 - dVar5;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar3;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar1;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar2;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_28 + -2][local_2c].bz)
      ;
      auVar31 = vfmadd213sd_fma(auVar25,auVar76,auVar88);
      auVar31 = vfmadd213sd_fma(auVar31,auVar43,auVar61);
      uVar2 = *(ulong *)(in_RDI + 0x48);
      uVar3 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar1 = (*pppcVar14)[local_28][local_2c].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar4 = (*pppcVar14)[local_28][local_2c + -1].by;
      dVar5 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar6 = (*pppcVar14)[local_28][local_2c + 1].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar7 = (*pppcVar14)[local_28][local_2c].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar8 = (*pppcVar14)[local_28][local_2c + -1].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar1 - dVar4;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar3;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = auVar31._0_8_;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_28][local_2c + -2].by)
      ;
      auVar31 = vfmadd213sd_fma(auVar26,auVar77,auVar89);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar2 ^ 0x8000000000000000;
      auVar31 = vfmadd213sd_fma(auVar31,auVar44,auVar62);
      pppcVar15 = field3d<cellj>::operator[]
                            ((field3d<cellj> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = auVar31._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(in_RDI + 0x20);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = -(*pppcVar15)[local_28][local_2c].jx;
      auVar31 = vfmadd213sd_fma(auVar27,auVar45,auVar63);
      pppcVar13 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      (*pppcVar13)[local_28][local_2c].ex = auVar31._0_8_;
    }
  }
  for (local_30 = 2; local_30 < iVar10 + -2; local_30 = local_30 + 1) {
    for (local_38 = 2; local_38 < iVar12 + -2; local_38 = local_38 + 1) {
      pppcVar13 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar1 = (*pppcVar13)[1][local_38].ey;
      uVar2 = *(ulong *)(in_RDI + 0x38);
      uVar3 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar4 = (*pppcVar14)[1][local_38].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar5 = (*pppcVar14)[1][local_38].bz;
      dVar6 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar7 = (*pppcVar14)[1][local_38].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar8 = (*pppcVar14)[1][local_38].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar9 = (*pppcVar14)[1][local_38].bz;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar4 - dVar5;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar3;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = dVar1;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[1][local_38].bz);
      auVar31 = vfmadd213sd_fma(auVar28,auVar78,auVar90);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar2 ^ 0x8000000000000000;
      auVar31 = vfmadd213sd_fma(auVar31,auVar46,auVar64);
      uVar2 = *(ulong *)(in_RDI + 0x48);
      uVar3 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar1 = (*pppcVar14)[1][local_38].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar4 = (*pppcVar14)[1][local_38 + -1].bx;
      dVar5 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar6 = (*pppcVar14)[1][local_38 + 1].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar7 = (*pppcVar14)[1][local_38].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar8 = (*pppcVar14)[1][local_38 + -1].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar1 - dVar4;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar3;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = auVar31._0_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[1][local_38 + -2].bx);
      auVar31 = vfmadd213sd_fma(auVar29,auVar79,auVar91);
      auVar31 = vfmadd213sd_fma(auVar31,auVar47,auVar65);
      pppcVar15 = field3d<cellj>::operator[]
                            ((field3d<cellj> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar31._0_8_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(in_RDI + 0x28);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = -(*pppcVar15)[1][local_38].jy;
      auVar31 = vfmadd213sd_fma(auVar30,auVar48,auVar66);
      pppcVar13 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      (*pppcVar13)[1][local_38].ey = auVar31._0_8_;
    }
  }
  for (local_3c = 2; local_3c < iVar10 + -2; local_3c = local_3c + 1) {
    for (local_40 = 2; local_40 < iVar11 + -2; local_40 = local_40 + 1) {
      pppcVar13 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar1 = (*pppcVar13)[local_40][1].ez;
      uVar2 = *(ulong *)(in_RDI + 0x38);
      uVar3 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      in_stack_fffffffffffffbf0 = (field3d<cellb> *)(*pppcVar14)[local_40][1].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar8 = (double)in_stack_fffffffffffffbf0 - (*pppcVar14)[local_40][1].by;
      dVar4 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar5 = (*pppcVar14)[local_40][1].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar6 = (*pppcVar14)[local_40][1].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar7 = (*pppcVar14)[local_40][1].by;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar8;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar3;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar1;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar2;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = dVar4 * (((dVar5 - dVar6) + dVar7) - (*pppcVar14)[local_40][1].by);
      auVar31 = vfmadd213sd_fma(auVar31,auVar80,auVar92);
      auVar31 = vfmadd213sd_fma(auVar31,auVar49,auVar67);
      uVar2 = *(ulong *)(in_RDI + 0x40);
      uVar3 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar1 = (*pppcVar14)[local_40][1].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar4 = (*pppcVar14)[local_40 + -1][1].bx;
      dVar5 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar6 = (*pppcVar14)[local_40 + 1][1].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar7 = (*pppcVar14)[local_40][1].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      dVar8 = (*pppcVar14)[local_40 + -1][1].bx;
      pppcVar14 = field3d<cellb>::operator[](in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar1 - dVar4;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar3;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = auVar31._0_8_;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_40 + -2][1].bx);
      auVar31 = vfmadd213sd_fma(auVar32,auVar81,auVar93);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar2 ^ 0x8000000000000000;
      auVar31 = vfmadd213sd_fma(auVar31,auVar50,auVar68);
      pppcVar15 = field3d<cellj>::operator[]
                            ((field3d<cellj> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = auVar31._0_8_;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(in_RDI + 0x30);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = -(*pppcVar15)[local_40][1].jz;
      auVar31 = vfmadd213sd_fma(auVar33,auVar51,auVar69);
      pppcVar13 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      (*pppcVar13)[local_40][1].ez = auVar31._0_8_;
    }
  }
  return;
}

Assistant:

void five_point_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;

                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;

                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=1;
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        {int j=1;
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            {int k=1;
                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
}